

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  AssertHelperData *this_00;
  AssertHelper *this_local;
  
  this_00 = this->data_;
  if (this_00 != (AssertHelperData *)0x0) {
    AssertHelperData::~AssertHelperData(this_00);
    operator_delete(this_00,0x38);
  }
  return;
}

Assistant:

AssertHelper::~AssertHelper() {
  delete data_;
}